

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Bool prvTidyFixDocType(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  Node *pNVar5;
  AttVal *pAVar6;
  tmbstr ptVar7;
  ctmbstr ptVar8;
  bool bVar9;
  uint local_30;
  Bool hadSI;
  uint guessed;
  uint dtmode;
  Node *doctype;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  _guessed = prvTidyFindDocType(doc);
  uVar2 = (doc->config).value[8].v;
  iVar3 = (int)uVar2;
  local_30 = 0;
  bVar9 = false;
  if (((_guessed == (Node *)0x0) || (iVar3 != 2)) || (pLVar1->doctype != 0x60000)) {
    if ((((iVar3 == 2) && ((pLVar1->versions & pLVar1->doctype) != 0)) &&
        (((pLVar1->doctype & 0x41f00) == 0 || (pLVar1->isvoyager != no)))) &&
       (pNVar5 = prvTidyFindDocType(doc), pNVar5 != (Node *)0x0)) {
      pLVar1->versionEmitted = pLVar1->doctype;
      doc_local._4_4_ = yes;
    }
    else if (iVar3 == 1) {
      if (_guessed != (Node *)0x0) {
        prvTidyDiscardElement(doc,_guessed);
      }
      uVar4 = prvTidyApparentVersion(doc);
      pLVar1->versionEmitted = uVar4;
      doc_local._4_4_ = yes;
    }
    else if ((int)(doc->config).value[0x19].v == 0) {
      if (_guessed != (Node *)0x0) {
        pAVar6 = prvTidyGetAttrByName(_guessed,"SYSTEM");
        bVar9 = pAVar6 != (AttVal *)0x0;
      }
      if (((iVar3 == 3) || (iVar3 == 4)) && (_guessed != (Node *)0x0)) {
        prvTidyDiscardElement(doc,_guessed);
        _guessed = (Node *)0x0;
      }
      switch(uVar2 & 0xffffffff) {
      case 0:
        local_30 = 0x20000;
        break;
      case 2:
        local_30 = prvTidyHTMLVersion(doc);
        break;
      case 3:
        local_30 = 0x20;
        break;
      case 4:
        local_30 = 0x40;
      }
      pLVar1->versionEmitted = local_30;
      if (local_30 == 0) {
        doc_local._4_4_ = no;
      }
      else {
        if (_guessed == (Node *)0x0) {
          _guessed = NewDocTypeNode(doc);
          ptVar7 = prvTidytmbstrdup(doc->allocator,"html");
          _guessed->element = ptVar7;
        }
        else {
          ptVar7 = prvTidytmbstrtolower(_guessed->element);
          _guessed->element = ptVar7;
        }
        ptVar8 = GetFPIFromVers(local_30);
        prvTidyRepairAttrValue(doc,_guessed,"PUBLIC",ptVar8);
        if (bVar9) {
          ptVar8 = GetSIFromVers(local_30);
          prvTidyRepairAttrValue(doc,_guessed,"SYSTEM",ptVar8);
        }
        doc_local._4_4_ = yes;
      }
    }
    else {
      doc_local._4_4_ = yes;
    }
  }
  else {
    pLVar1->versionEmitted = pLVar1->doctype;
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(FixDocType)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    Node* doctype = TY_(FindDocType)( doc );
    uint dtmode = cfg( doc, TidyDoctypeMode );
    uint guessed = VERS_UNKNOWN;
    Bool hadSI = no;

    /* Issue #167 - found doctype, and doctype is default VERS_HTML5, set VERS_HTML5 and return yes */
    if (doctype && (dtmode == TidyDoctypeAuto) &&
        (lexer->doctype == VERS_HTML5) )
    {
        lexer->versionEmitted = lexer->doctype;
        return yes;
    }
    if (dtmode == TidyDoctypeAuto &&
        lexer->versions & lexer->doctype &&
        !(VERS_XHTML & lexer->doctype && !lexer->isvoyager)
        && TY_(FindDocType)(doc))
    {
        lexer->versionEmitted = lexer->doctype;
        return yes;
    }

    if (dtmode == TidyDoctypeOmit)
    {
        if (doctype)
            TY_(DiscardElement)( doc, doctype );
        lexer->versionEmitted = TY_(ApparentVersion)( doc );
        return yes;
    }

    if (cfgBool(doc, TidyXmlOut))
        return yes;

    if (doctype)
        hadSI = TY_(GetAttrByName)(doctype, "SYSTEM") != NULL;

    if ((dtmode == TidyDoctypeStrict ||
         dtmode == TidyDoctypeLoose) && doctype)
    {
        TY_(DiscardElement)(doc, doctype);
        doctype = NULL;
    }

    switch (dtmode)
    {
    case TidyDoctypeHtml5:
        guessed = HT50;
        break;
    case TidyDoctypeStrict:
        guessed = H41S;
        break;
    case TidyDoctypeLoose:
        guessed = H41T;
        break;
    case TidyDoctypeAuto:
        guessed = TY_(HTMLVersion)(doc);
        break;
    }

    lexer->versionEmitted = guessed;
    if (guessed == VERS_UNKNOWN)
        return no;

    if (doctype)
    {
        doctype->element = TY_(tmbstrtolower)(doctype->element);
    }
    else
    {
        doctype = NewDocTypeNode(doc);
        doctype->element = TY_(tmbstrdup)(doc->allocator, "html");
    }

    TY_(RepairAttrValue)(doc, doctype, "PUBLIC", GetFPIFromVers(guessed));

    if (hadSI)
        TY_(RepairAttrValue)(doc, doctype, "SYSTEM", GetSIFromVers(guessed));

    return yes;
}